

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::ComputePrefixes(cmFindPackageCommand *this)

{
  if ((this->super_cmFindCommon).NoDefaultPath == false) {
    if ((this->super_cmFindCommon).NoPackageRootPath == false) {
      FillPrefixesPackageRoot(this);
    }
    if ((this->super_cmFindCommon).NoCMakePath == false) {
      FillPrefixesCMakeVariable(this);
    }
    if ((this->super_cmFindCommon).NoCMakeEnvironmentPath == false) {
      FillPrefixesCMakeEnvironment(this);
    }
  }
  FillPrefixesUserHints(this);
  if ((this->super_cmFindCommon).NoDefaultPath == false) {
    if ((this->super_cmFindCommon).NoSystemEnvironmentPath == false) {
      FillPrefixesSystemEnvironment(this);
    }
    if (this->NoUserRegistry == false) {
      FillPrefixesUserRegistry(this);
    }
    if ((this->super_cmFindCommon).NoCMakeSystemPath == false) {
      FillPrefixesCMakeSystemVariable(this);
    }
  }
  FillPrefixesUserGuess(this);
  cmFindCommon::ComputeFinalPaths(&this->super_cmFindCommon);
  return;
}

Assistant:

void cmFindPackageCommand::ComputePrefixes()
{
  if (!this->NoDefaultPath) {
    if (!this->NoPackageRootPath) {
      this->FillPrefixesPackageRoot();
    }
    if (!this->NoCMakePath) {
      this->FillPrefixesCMakeVariable();
    }
    if (!this->NoCMakeEnvironmentPath) {
      this->FillPrefixesCMakeEnvironment();
    }
  }
  this->FillPrefixesUserHints();
  if (!this->NoDefaultPath) {
    if (!this->NoSystemEnvironmentPath) {
      this->FillPrefixesSystemEnvironment();
    }
    if (!this->NoUserRegistry) {
      this->FillPrefixesUserRegistry();
    }
    if (!this->NoCMakeSystemPath) {
      this->FillPrefixesCMakeSystemVariable();
    }
    if (!this->NoSystemRegistry) {
      this->FillPrefixesSystemRegistry();
    }
  }
  this->FillPrefixesUserGuess();

  this->ComputeFinalPaths();
}